

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
::find_position<HashObject<256,32>>
          (sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
           *this,HashObject<256,_32> *key)

{
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined6 uVar4;
  undefined1 auVar5 [12];
  bool bVar6;
  long lVar7;
  const_reference ppVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  short sVar16;
  undefined1 auVar17 [16];
  pair<unsigned_long,_unsigned_long> pVar22;
  ulong local_40;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 uVar20;
  undefined2 uVar21;
  
  lVar2 = *(long *)(this + 0x140);
  g_num_hashes = g_num_hashes + 1;
  iVar12 = key->i_;
  iVar13 = 0;
  iVar14 = 0;
  iVar15 = 0;
  lVar7 = 4;
  do {
    uVar1 = *(undefined4 *)(key->buffer_ + lVar7 + -4);
    uVar20 = (undefined1)((uint)uVar1 >> 0x18);
    uVar21 = CONCAT11(uVar20,uVar20);
    uVar20 = (undefined1)((uint)uVar1 >> 0x10);
    uVar3 = CONCAT35(CONCAT21(uVar21,uVar20),CONCAT14(uVar20,uVar1));
    uVar20 = (undefined1)((uint)uVar1 >> 8);
    uVar4 = CONCAT51(CONCAT41((int)((ulong)uVar3 >> 0x20),uVar20),uVar20);
    sVar16 = CONCAT11((char)uVar1,(char)uVar1);
    uVar9 = CONCAT62(uVar4,sVar16);
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar9;
    auVar19._12_2_ = uVar21;
    auVar19._14_2_ = uVar21;
    uVar21 = (undefined2)((ulong)uVar3 >> 0x20);
    auVar18._12_4_ = auVar19._12_4_;
    auVar18._8_2_ = 0;
    auVar18._0_8_ = uVar9;
    auVar18._10_2_ = uVar21;
    auVar17._10_6_ = auVar18._10_6_;
    auVar17._8_2_ = uVar21;
    auVar17._0_8_ = uVar9;
    uVar21 = (undefined2)uVar4;
    auVar5._4_8_ = auVar17._8_8_;
    auVar5._2_2_ = uVar21;
    auVar5._0_2_ = uVar21;
    iVar12 = iVar12 + ((int)sVar16 >> 8);
    iVar13 = iVar13 + (auVar5._0_4_ >> 0x18);
    iVar14 = iVar14 + (auVar17._8_4_ >> 0x18);
    iVar15 = iVar15 + (auVar18._12_4_ >> 0x18);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x20);
  uVar9 = (ulong)(iVar15 + iVar13 + iVar14 + iVar12);
  local_40 = 0xffffffffffffffff;
  lVar7 = 1;
  do {
    uVar9 = uVar9 & lVar2 - 1U;
    lVar10 = (uVar9 / 0x30) * 0x10;
    uVar11 = uVar9 % 0x30;
    if ((*(byte *)((uVar11 >> 3) + 10 + *(long *)(this + 0x128) + lVar10) >> ((uint)uVar11 & 7) & 1)
        == 0) {
      uVar11 = uVar9;
      if (local_40 != 0xffffffffffffffff) {
        uVar11 = local_40;
      }
      uVar9 = 0xffffffffffffffff;
LAB_00137d66:
      pVar22.second = uVar11;
      pVar22.first = uVar9;
      return pVar22;
    }
    bVar6 = sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            ::test_deleted((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                            *)this,uVar9);
    if (bVar6) {
      if (local_40 == 0xffffffffffffffff) {
        local_40 = uVar9;
      }
    }
    else {
      ppVar8 = sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               ::unsafe_get((sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                             *)(lVar10 + *(long *)(this + 0x128)),(size_type_conflict)uVar11);
      if (key->i_ == (ppVar8->first).i_) {
        uVar11 = 0xffffffffffffffff;
        goto LAB_00137d66;
      }
    }
    uVar9 = uVar9 + lVar7;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }